

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O3

void fullsize_smooth_downsample
               (j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
               JSAMPARRAY output_data)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  byte *pbVar9;
  JSAMPROW pJVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  
  iVar15 = compptr->DCT_h_scaled_size * compptr->width_in_blocks;
  uVar2 = cinfo->image_width;
  iVar6 = cinfo->max_v_samp_factor;
  if (-2 < iVar6 && 0 < (int)(iVar15 - uVar2)) {
    uVar16 = 0;
    do {
      memset(input_data[uVar16 - 1] + uVar2,(uint)input_data[uVar16 - 1][(ulong)uVar2 - 1],
             (ulong)(~uVar2 + iVar15) + 1);
      uVar16 = uVar16 + 1;
    } while (iVar6 + 2 != uVar16);
    iVar6 = cinfo->max_v_samp_factor;
  }
  if (0 < iVar6) {
    iVar7 = cinfo->smoothing_factor * -0x200 + 0x10000;
    iVar6 = cinfo->smoothing_factor * 0x40;
    lVar8 = 0;
    do {
      pbVar3 = input_data[lVar8 + -1];
      pbVar4 = input_data[lVar8];
      pbVar5 = input_data[lVar8 + 1];
      bVar1 = *pbVar4;
      iVar12 = (uint)*pbVar5 + (uint)*pbVar3 + (uint)bVar1;
      pbVar9 = pbVar4 + 1;
      iVar11 = (uint)pbVar4[1] + (uint)pbVar5[1] + (uint)pbVar3[1];
      pJVar10 = output_data[lVar8] + 1;
      *output_data[lVar8] =
           (JSAMPLE)((uint)bVar1 * iVar7 + ((iVar12 * 2 - (uint)bVar1) + iVar11) * iVar6 + 0x8000 >>
                    0x10);
      if (iVar15 != 2) {
        lVar14 = 0;
        iVar13 = iVar12;
        do {
          iVar12 = iVar11;
          iVar11 = (uint)pbVar4[lVar14 + 2] + (uint)pbVar5[lVar14 + 2] + (uint)pbVar3[lVar14 + 2];
          pJVar10[lVar14] =
               (JSAMPLE)((((iVar13 + iVar12) - (uint)pbVar9[lVar14]) + iVar11) * iVar6 +
                         (uint)pbVar9[lVar14] * iVar7 + 0x8000 >> 0x10);
          lVar14 = lVar14 + 1;
          iVar13 = iVar12;
        } while (iVar15 + -2 != (int)lVar14);
        pJVar10 = pJVar10 + lVar14;
        pbVar9 = pbVar9 + lVar14;
      }
      lVar8 = lVar8 + 1;
      *pJVar10 = (JSAMPLE)((uint)*pbVar9 * iVar7 + ((iVar12 + iVar11 * 2) - (uint)*pbVar9) * iVar6 +
                           0x8000 >> 0x10);
    } while (lVar8 < cinfo->max_v_samp_factor);
  }
  return;
}

Assistant:

METHODDEF(void)
fullsize_smooth_downsample (j_compress_ptr cinfo, jpeg_component_info *compptr,
			    JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  int inrow;
  JDIMENSION colctr;
  JDIMENSION output_cols = compptr->width_in_blocks * compptr->DCT_h_scaled_size;
  register JSAMPROW inptr, above_ptr, below_ptr, outptr;
  INT32 membersum, neighsum, memberscale, neighscale;
  int colsum, lastcolsum, nextcolsum;

  /* Expand input data enough to let all the output samples be generated
   * by the standard loop.  Special-casing padded output would be more
   * efficient.
   */
  expand_right_edge(input_data - 1, cinfo->max_v_samp_factor + 2,
		    cinfo->image_width, output_cols);

  /* Each of the eight neighbor pixels contributes a fraction SF to the
   * smoothed pixel, while the main pixel contributes (1-8*SF).  In order
   * to use integer arithmetic, these factors are multiplied by 2^16 = 65536.
   * Also recall that SF = smoothing_factor / 1024.
   */

  memberscale = 65536L - cinfo->smoothing_factor * 512L; /* scaled 1-8*SF */
  neighscale = cinfo->smoothing_factor * 64; /* scaled SF */

  for (inrow = 0; inrow < cinfo->max_v_samp_factor; inrow++) {
    outptr = output_data[inrow];
    inptr = input_data[inrow];
    above_ptr = input_data[inrow-1];
    below_ptr = input_data[inrow+1];

    /* Special case for first column */
    colsum = GETJSAMPLE(*above_ptr++) + GETJSAMPLE(*below_ptr++) +
	     GETJSAMPLE(*inptr);
    membersum = GETJSAMPLE(*inptr++);
    nextcolsum = GETJSAMPLE(*above_ptr) + GETJSAMPLE(*below_ptr) +
		 GETJSAMPLE(*inptr);
    neighsum = colsum + (colsum - membersum) + nextcolsum;
    membersum = membersum * memberscale + neighsum * neighscale;
    *outptr++ = (JSAMPLE) ((membersum + 32768) >> 16);
    lastcolsum = colsum; colsum = nextcolsum;

    for (colctr = output_cols - 2; colctr > 0; colctr--) {
      membersum = GETJSAMPLE(*inptr++);
      above_ptr++; below_ptr++;
      nextcolsum = GETJSAMPLE(*above_ptr) + GETJSAMPLE(*below_ptr) +
		   GETJSAMPLE(*inptr);
      neighsum = lastcolsum + (colsum - membersum) + nextcolsum;
      membersum = membersum * memberscale + neighsum * neighscale;
      *outptr++ = (JSAMPLE) ((membersum + 32768) >> 16);
      lastcolsum = colsum; colsum = nextcolsum;
    }

    /* Special case for last column */
    membersum = GETJSAMPLE(*inptr);
    neighsum = lastcolsum + (colsum - membersum) + colsum;
    membersum = membersum * memberscale + neighsum * neighscale;
    *outptr = (JSAMPLE) ((membersum + 32768) >> 16);

  }
}